

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O2

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"cirs2gal",(allocator *)&local_50);
  CEExecOptions::CEExecOptions(in_RDI,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_50);
  std::__cxx11::string::string((string *)&local_30);
  std::operator+(&local_50,&local_30,
                 "Converts from CIRS coordinates to Galactic coordinates for a given ");
  std::operator+(&local_70,&local_50,"Julian date.");
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  CEExecOptions::AddCirsPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("cirs2gal");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Converts from CIRS coordinates to Galactic coordinates for a given " +
        "Julian date.");
        
    // Set the options
    opts.AddCirsPars();
    opts.AddJDPar();
    
    return opts;
}